

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O3

void free_storable_picture(H264_DecCtx_t *p_Dec,H264_StorePic_t *p)

{
  H264_Mem_type HVar1;
  
  if (p != (H264_StorePic_t *)0x0) {
    HVar1 = p->mem_malloc_type;
    if (HVar1 - Mem_Malloc < 2) {
      free_dpb_mark(p_Dec,p->mem_mark,p->structure);
      HVar1 = p->mem_malloc_type;
    }
    if (HVar1 == Mem_TopOnly) {
      free_dpb_mark(p_Dec,p->mem_mark,1);
      HVar1 = p->mem_malloc_type;
    }
    if (HVar1 == Mem_BotOnly) {
      free_dpb_mark(p_Dec,p->mem_mark,2);
    }
    mpp_mem_pool_put_f("free_storable_picture",p_Dec->p_Vid->pic_st,p);
    return;
  }
  return;
}

Assistant:

void free_storable_picture(H264_DecCtx_t *p_Dec, H264_StorePic_t *p)
{
    if (p) {
        if (p->mem_malloc_type == Mem_Malloc
            || p->mem_malloc_type == Mem_Clone) {
            free_dpb_mark(p_Dec, p->mem_mark, p->structure);
        }
        if (p->mem_malloc_type == Mem_TopOnly) {
            free_dpb_mark(p_Dec, p->mem_mark, TOP_FIELD);
        }
        if (p->mem_malloc_type == Mem_BotOnly) {
            free_dpb_mark(p_Dec, p->mem_mark, BOTTOM_FIELD);
        }
        mpp_mem_pool_put(p_Dec->p_Vid->pic_st, p);
    }
}